

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::RecordJsRTEquals
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,Var var1,Var var2,
          bool doStrict)

{
  EventLogEntry *actionEvent;
  EventLogEntry *evt;
  JsRTDoubleVarSingleScalarArgumentAction *gpAction;
  Var pvStack_28;
  bool doStrict_local;
  Var var2_local;
  Var var1_local;
  TTDJsRTActionResultAutoRecorder *actionPopper_local;
  EventLog *this_local;
  
  evt = (EventLogEntry *)0x0;
  gpAction._7_1_ = doStrict;
  pvStack_28 = var2;
  var2_local = var1;
  var1_local = actionPopper;
  actionPopper_local = (TTDJsRTActionResultAutoRecorder *)this;
  actionEvent = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<2ul,1ul>,(TTD::NSLogEvents::EventKind)47>
                          (this,(JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> **)&evt);
  NSLogEvents::SetVarItem_0<2ul,1ul>
            ((JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> *)evt,var2_local);
  NSLogEvents::SetVarItem_1<2ul,1ul>
            ((JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> *)evt,pvStack_28);
  NSLogEvents::SetScalarItem_0<2ul,1ul>
            ((JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> *)evt,
             (ulong)(gpAction._7_1_ & 1));
  TTDJsRTActionResultAutoRecorder::InitializeWithEventAndEnter
            ((TTDJsRTActionResultAutoRecorder *)var1_local,actionEvent);
  return;
}

Assistant:

void EventLog::RecordJsRTEquals(TTDJsRTActionResultAutoRecorder& actionPopper, Js::Var var1, Js::Var var2, bool doStrict)
    {
        NSLogEvents::JsRTDoubleVarSingleScalarArgumentAction* gpAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTDoubleVarSingleScalarArgumentAction, NSLogEvents::EventKind::EqualsActionTag>(&gpAction);
        NSLogEvents::SetVarItem_0(gpAction, TTD_CONVERT_JSVAR_TO_TTDVAR(var1));
        NSLogEvents::SetVarItem_1(gpAction, TTD_CONVERT_JSVAR_TO_TTDVAR(var2));
        NSLogEvents::SetScalarItem_0(gpAction, doStrict);

        actionPopper.InitializeWithEventAndEnter(evt);
    }